

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_Init(void *arkode_mem,int init_type)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  N_Vector p_Var4;
  int in_ESI;
  int reset_efun;
  int retval;
  int j;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint degree;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = arkStep_AccessStepMem
                    (in_stack_ffffffffffffffd8,
                     (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (ARKodeARKStepMem *)0xe89f68);
  if (iVar1 == 0) {
    if (in_ESI == 1) {
      iVar1 = 0;
    }
    else {
      if (in_ESI == 0) {
        degree = (uint)(in_stack_ffffffffffffffd8->ritol == 0);
        if (local_20->fixedstep == 0) {
          degree = 0;
        }
        if (local_20->user_efun != 0) {
          degree = 0;
        }
        if ((local_20->rwt_is_ewt != 0) && (*(int *)((long)&in_stack_ffffffffffffffd8->h + 4) == 1))
        {
          degree = 0;
        }
        if ((local_20->rwt_is_ewt != 0) && (*(int *)((long)&in_stack_ffffffffffffffd8->h + 4) == 2))
        {
          degree = 0;
        }
        if (degree != 0) {
          local_20->user_efun = 0;
          local_20->efun = arkEwtSetSmallReal;
          local_20->e_data = local_20;
        }
        iVar1 = arkStep_SetButcherTables
                          ((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
        ;
        if (iVar1 != 0) {
          arkProcessError(local_20,-0x16,"ARKode::ARKStep","arkStep_Init",
                          "Could not create Butcher table(s)");
          return -0x16;
        }
        iVar1 = arkStep_CheckButcherTables((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        if (iVar1 != 0) {
          arkProcessError(local_20,-0x16,"ARKode::ARKStep","arkStep_Init",
                          "Error in Butcher table(s)");
          return -0x16;
        }
        if (*(long *)&in_stack_ffffffffffffffd8->user_rfun == 0) {
          iVar2 = *in_stack_ffffffffffffffd8->e_data;
          local_20->hadapt_mem->q = iVar2;
          in_stack_ffffffffffffffd8->Ratolmin0 = iVar2;
          iVar2 = *(int *)((long)in_stack_ffffffffffffffd8->e_data + 4);
          local_20->hadapt_mem->p = iVar2;
          in_stack_ffffffffffffffd8->user_efun = iVar2;
        }
        else {
          iVar2 = **(int **)&in_stack_ffffffffffffffd8->user_rfun;
          local_20->hadapt_mem->q = iVar2;
          in_stack_ffffffffffffffd8->Ratolmin0 = iVar2;
          iVar2 = *(int *)(*(long *)&in_stack_ffffffffffffffd8->user_rfun + 4);
          local_20->hadapt_mem->p = iVar2;
          in_stack_ffffffffffffffd8->user_efun = iVar2;
        }
        if ((local_20->fixedstep == 0) && (in_stack_ffffffffffffffd8->user_efun == 0)) {
          arkProcessError(local_20,-0x16,"ARKode::ARKStep","arkStep_Init",
                          "Adaptive timestepping cannot be performed without embedding coefficients"
                         );
          return -0x16;
        }
        if (in_stack_ffffffffffffffd8->itol != 0) {
          if (in_stack_ffffffffffffffd8->Sabstol == 0.0) {
            pvVar3 = calloc((long)*(int *)((long)&in_stack_ffffffffffffffd8->efun + 4),8);
            in_stack_ffffffffffffffd8->Sabstol = (realtype)pvVar3;
          }
          for (in_stack_ffffffffffffffd4 = 0;
              in_stack_ffffffffffffffd4 < *(int *)((long)&in_stack_ffffffffffffffd8->efun + 4);
              in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
            iVar2 = arkAllocVec(in_stack_ffffffffffffffd8,
                                (N_Vector)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
                                (N_Vector *)CONCAT44(degree,in_stack_ffffffffffffffc8));
            if (iVar2 == 0) {
              return -0x14;
            }
          }
          local_20->liw = (long)*(int *)((long)&in_stack_ffffffffffffffd8->efun + 4) + local_20->liw
          ;
        }
        if (in_stack_ffffffffffffffd8->ritol != 0) {
          if (in_stack_ffffffffffffffd8->Vabstol == (N_Vector)0x0) {
            p_Var4 = (N_Vector)calloc((long)*(int *)((long)&in_stack_ffffffffffffffd8->efun + 4),8);
            in_stack_ffffffffffffffd8->Vabstol = p_Var4;
          }
          for (in_stack_ffffffffffffffd4 = 0;
              in_stack_ffffffffffffffd4 < *(int *)((long)&in_stack_ffffffffffffffd8->efun + 4);
              in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
            iVar2 = arkAllocVec(in_stack_ffffffffffffffd8,
                                (N_Vector)CONCAT44(in_stack_ffffffffffffffd4,iVar1),
                                (N_Vector *)CONCAT44(degree,in_stack_ffffffffffffffc8));
            if (iVar2 == 0) {
              return -0x14;
            }
          }
          local_20->liw = (long)*(int *)((long)&in_stack_ffffffffffffffd8->efun + 4) + local_20->liw
          ;
        }
        in_stack_ffffffffffffffd8->fixedstep =
             *(int *)((long)&in_stack_ffffffffffffffd8->efun + 4) * 2 + 2 +
             (int)in_stack_ffffffffffffffd8->nst_attempts;
        if (in_stack_ffffffffffffffd8->tcur == 0.0) {
          pvVar3 = calloc((long)in_stack_ffffffffffffffd8->fixedstep,8);
          in_stack_ffffffffffffffd8->tcur = (realtype)pvVar3;
          if (in_stack_ffffffffffffffd8->tcur == 0.0) {
            return -0x14;
          }
          local_20->lrw = (long)in_stack_ffffffffffffffd8->fixedstep + local_20->lrw;
        }
        if (in_stack_ffffffffffffffd8->tretlast == 0.0) {
          pvVar3 = calloc((long)in_stack_ffffffffffffffd8->fixedstep,8);
          in_stack_ffffffffffffffd8->tretlast = (realtype)pvVar3;
          if (in_stack_ffffffffffffffd8->tretlast == 0.0) {
            return -0x14;
          }
          local_20->liw = (long)in_stack_ffffffffffffffd8->fixedstep + local_20->liw;
        }
        if ((local_20->interp != (ARKInterp)0x0) &&
           (iVar1 = arkInterpSetDegree(in_stack_ffffffffffffffd8,
                                       (ARKInterp)CONCAT44(in_stack_ffffffffffffffd4,iVar1),degree),
           iVar1 != 0)) {
          arkProcessError(local_20,-0x16,"ARKode::ARKStep","arkStep_Init",
                          "Unable to update interpolation polynomial degree");
          return -0x16;
        }
        if ((*(int *)&in_stack_ffffffffffffffd8->h != 0) &&
           ((*(int *)&in_stack_ffffffffffffffd8->step_getmassmem == 4 ||
            (*(int *)&in_stack_ffffffffffffffd8->step_getmassmem == 5)))) {
          *(undefined4 *)&in_stack_ffffffffffffffd8->step_getmassmem = 0;
        }
        if (*(int *)&in_stack_ffffffffffffffd8->step_getmassmem == 4) {
          local_20->call_fullrhs = 1;
        }
      }
      local_20->step = arkStep_TakeStep_Z;
      if (((*(int *)&in_stack_ffffffffffffffd8->h == 0) ||
          (in_stack_ffffffffffffffd8->tempv2 == (N_Vector)0x0)) ||
         (*(int *)&in_stack_ffffffffffffffd8->tempv3 ==
          *(int *)((long)&in_stack_ffffffffffffffd8->h + 4))) {
        if (*(int *)&in_stack_ffffffffffffffd8->h != 0) {
          if ((in_stack_ffffffffffffffd8->tempv4 != (N_Vector)0x0) &&
             (iVar1 = (*(code *)in_stack_ffffffffffffffd8->tempv4)(local_20), iVar1 != 0)) {
            arkProcessError(local_20,-0xe,"ARKode::ARKStep","arkStep_Init",
                            "The mass matrix solver\'s init routine failed.");
            return -0xe;
          }
          if ((in_stack_ffffffffffffffd8->constraints != (N_Vector)0x0) &&
             (iVar1 = (*(code *)in_stack_ffffffffffffffd8->constraints)
                                (local_20->tcur,local_20,local_20->tempv1,local_20->tempv2,
                                 local_20->tempv3), iVar1 != 0)) {
            arkProcessError(local_20,-0xf,"ARKode::ARKStep","arkStep_Init",
                            "The mass matrix solver\'s setup routine failed.");
            return -0xf;
          }
        }
        if ((in_stack_ffffffffffffffd8->ycur == (N_Vector)0x0) ||
           (iVar1 = (*(code *)in_stack_ffffffffffffffd8->ycur)(local_20), iVar1 == 0)) {
          if ((in_stack_ffffffffffffffd8->r_data == (void *)0x0) ||
             (iVar1 = arkStep_NlsInit(in_stack_ffffffffffffffd8), iVar1 == 0)) {
            iVar1 = 0;
          }
          else {
            arkProcessError(local_20,-0x1d,"ARKode::ARKStep","arkStep_Init",
                            "Unable to initialize SUNNonlinearSolver object");
            iVar1 = -0x1d;
          }
        }
        else {
          arkProcessError(local_20,-5,"ARKode::ARKStep","arkStep_Init",
                          "The linear solver\'s init routine failed.");
          iVar1 = -5;
        }
      }
      else {
        arkProcessError(local_20,-0x16,"ARKode::ARKStep","arkStep_Init",
                        "Incompatible linear and mass matrix solvers");
        iVar1 = -0x16;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int j, retval;
  booleantype reset_efun;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* immediately return if reset */
  if (init_type == RESET_INIT) return(ARK_SUCCESS);

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT) {

    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method, an internal error weight function, and not
       using an iterative mass matrix solver with rwt=ewt */
    reset_efun = SUNTRUE;
    if ( step_mem->implicit )   reset_efun = SUNFALSE;
    if ( !ark_mem->fixedstep )  reset_efun = SUNFALSE;
    if ( ark_mem->user_efun )   reset_efun = SUNFALSE;
    if ( ark_mem->rwt_is_ewt && (step_mem->msolve_type == SUNLINEARSOLVER_ITERATIVE) )
      reset_efun = SUNFALSE;
    if ( ark_mem->rwt_is_ewt && (step_mem->msolve_type == SUNLINEARSOLVER_MATRIX_ITERATIVE) )
      reset_efun = SUNFALSE;
    if (reset_efun) {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* Create Butcher tables (if not already set) */
    retval = arkStep_SetButcherTables(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Could not create Butcher table(s)");
      return(ARK_ILL_INPUT);
    }

    /* Check that Butcher tables are OK */
    retval = arkStep_CheckButcherTables(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "arkStep_Init", "Error in Butcher table(s)");
      return(ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    if (step_mem->Bi != NULL) {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Bi->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Bi->p;
    } else {
      step_mem->q = ark_mem->hadapt_mem->q = step_mem->Be->q;
      step_mem->p = ark_mem->hadapt_mem->p = step_mem->Be->p;
    }

    /* Ensure that if adaptivity is enabled, then method includes embedding coefficients */
    if (!ark_mem->fixedstep && (step_mem->p == 0)) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Adaptive timestepping cannot be performed without embedding coefficients");
      return(ARK_ILL_INPUT);
    }

    /* Allocate ARK RHS vector memory, update storage requirements */
    /*   Allocate Fe[0] ... Fe[stages-1] if needed */
    if (step_mem->explicit) {
      if (step_mem->Fe == NULL)
        step_mem->Fe = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
      for (j=0; j<step_mem->stages; j++) {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fe[j])))
          return(ARK_MEM_FAIL);
      }
      ark_mem->liw += step_mem->stages;  /* pointers */
    }

    /*   Allocate Fi[0] ... Fi[stages-1] if needed */
    if (step_mem->implicit) {
      if (step_mem->Fi == NULL)
        step_mem->Fi = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
      for (j=0; j<step_mem->stages; j++) {
        if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->Fi[j])))
          return(ARK_MEM_FAIL);
      }
      ark_mem->liw += step_mem->stages;  /* pointers */
    }

    /* Allocate reusable arrays for fused vector operations */
    step_mem->nfusedopvecs = 2 * step_mem->stages + 2 + step_mem->nforcing;
    if (step_mem->cvals == NULL) {
      step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs,
                                            sizeof(realtype));
      if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
      ark_mem->lrw += step_mem->nfusedopvecs;
    }
    if (step_mem->Xvecs == NULL) {
      step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs,
                                            sizeof(N_Vector));
      if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
      ark_mem->liw += step_mem->nfusedopvecs;   /* pointers */
    }

    /* Limit interpolant degree based on method order (use negative
       argument to specify update instead of overwrite) */
    if (ark_mem->interp != NULL) {
      retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
      if (retval != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                        "Unable to update interpolation polynomial degree");
        return(ARK_ILL_INPUT);
      }
    }

    /* If configured with either predictor 4 or 5 and a non-identity mass
       matrix, reset to trivial predictor */
    if (step_mem->mass_type != MASS_IDENTITY)
      if ((step_mem->predictor == 4) || (step_mem->predictor == 5))
        step_mem->predictor = 0;

    /* If the bootstrap predictor is enabled, signal to shared arkode module that
       fullrhs is required after each step */
    if (step_mem->predictor == 4)  ark_mem->call_fullrhs = SUNTRUE;
  }

  /* set appropriate TakeStep routine based on problem configuration */
  /*    (only one choice for now) */
  ark_mem->step = arkStep_TakeStep_Z;

  /* Check for consistency between mass system and system linear system modules
     (e.g., if lsolve is direct, msolve needs to match) */
  if ((step_mem->mass_type != MASS_IDENTITY) && step_mem->lmem) {
    if (step_mem->lsolve_type != step_mem->msolve_type) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep", "arkStep_Init",
                      "Incompatible linear and mass matrix solvers");
      return(ARK_ILL_INPUT);
    }
  }

  /* Perform mass matrix solver initialization and setup (if applicable) */
  if (step_mem->mass_type != MASS_IDENTITY) {

    /* Call minit (if it exists) */
    if (step_mem->minit != NULL) {
      retval = step_mem->minit((void *) ark_mem);
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_MASSINIT_FAIL, "ARKode::ARKStep",
                        "arkStep_Init", MSG_ARK_MASSINIT_FAIL);
        return(ARK_MASSINIT_FAIL);
      }
    }

    /* Call msetup (if it exists) */
    if (step_mem->msetup != NULL) {
      retval = step_mem->msetup((void *) ark_mem, ark_mem->tcur,
                                ark_mem->tempv1, ark_mem->tempv2,
                                ark_mem->tempv3);
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_MASSSETUP_FAIL, "ARKode::ARKStep",
                        "arkStep_Init", MSG_ARK_MASSSETUP_FAIL);
        return(ARK_MASSSETUP_FAIL);
      }
    }
  }

  /* Call linit (if it exists) */
  if (step_mem->linit) {
    retval = step_mem->linit(ark_mem);
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, "ARKode::ARKStep",
                      "arkStep_Init", MSG_ARK_LINIT_FAIL);
      return(ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS) {
    retval = arkStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, "ARKode::ARKStep", "arkStep_Init",
                      "Unable to initialize SUNNonlinearSolver object");
      return(ARK_NLS_INIT_FAIL);
    }
  }

  return(ARK_SUCCESS);
}